

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

size_t openMerkleTreeSize(size_t numNodes,uint16_t *missingLeaves,size_t missingLeavesSize,
                         picnic_instance_t *params)

{
  _Bool _Var1;
  uint *__ptr;
  long in_RCX;
  size_t *in_RDX;
  size_t in_RSI;
  uint16_t *in_RDI;
  uint *revealed;
  size_t revealedSize;
  tree_t tree;
  undefined8 in_stack_ffffffffffffffb0;
  long lVar2;
  tree_t *in_stack_ffffffffffffffb8;
  tree_t *in_stack_fffffffffffffff8;
  size_t sVar3;
  
  _Var1 = createTree(in_stack_ffffffffffffffb8,(uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                     (uint)in_stack_ffffffffffffffb0);
  if (_Var1) {
    lVar2 = 0;
    __ptr = getRevealedMerkleNodes(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
    clearTree((tree_t *)0x159281);
    free(__ptr);
    sVar3 = lVar2 * (ulong)*(byte *)(in_RCX + 6);
  }
  else {
    sVar3 = 0xffffffffffffffff;
  }
  return sVar3;
}

Assistant:

size_t openMerkleTreeSize(size_t numNodes, uint16_t* missingLeaves, size_t missingLeavesSize,
                          const picnic_instance_t* params) {
  tree_t tree;
  if (!createTree(&tree, numNodes, params->digest_size)) {
    return SIZE_MAX;
  }

  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(&tree, missingLeaves, missingLeavesSize, &revealedSize);

  clearTree(&tree);
  free(revealed);

  return revealedSize * params->digest_size;
}